

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neural_net.cpp
# Opt level: O3

int __thiscall Net::predict(Net *this,Table *input)

{
  pointer pdVar1;
  pointer pvVar2;
  int iVar3;
  pointer pvVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  double dVar9;
  
  pvVar4 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + 8) !=
      (pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar8 = 0;
    do {
      dVar9 = Table::get_value(input,(int)uVar8,0);
      pvVar4 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data;
      *(double *)(lVar5 + uVar8 * 8) = dVar9;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)*(pointer *)
                                    ((long)&(pvVar4->
                                            super__Vector_base<double,_std::allocator<double>_>).
                                            _M_impl.super__Vector_impl_data + 8) - lVar5 >> 3));
  }
  pvVar2 = (this->mesh).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (1 < (int)((ulong)((long)pvVar2 - (long)pvVar4) >> 3) * -0x55555555) {
    iVar6 = 1;
    do {
      propagate_front(this,iVar6);
      pvVar2 = (this->mesh).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      iVar6 = iVar6 + 1;
      iVar3 = (int)((ulong)((long)pvVar2 -
                           (long)(this->mesh).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(iVar6,iVar3 * -0x55555555) != iVar6 + iVar3 * 0x55555555 < 0);
  }
  pdVar1 = pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)pvVar2[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  if (lVar5 == 0) {
    iVar6 = 0;
  }
  else {
    lVar5 = lVar5 >> 3;
    lVar7 = 0;
    iVar6 = 0;
    do {
      iVar3 = (int)lVar7;
      if (pdVar1[lVar7] < pdVar1[iVar6] || pdVar1[lVar7] == pdVar1[iVar6]) {
        iVar3 = iVar6;
      }
      iVar6 = iVar3;
      lVar7 = lVar7 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
  }
  return iVar6;
}

Assistant:

int Net::predict(Table input){
    for (int x = 0; x < mesh[0].size(); ++x)
        mesh[0][x] = input.get_value(x, 0);
    for (int layer = 1; layer < (int)mesh.size(); ++layer)
        propagate_front(layer);

    int maxx = 0;
    for (int i = 0; i < mesh.back().size(); ++i)
        if (mesh.back()[maxx] < mesh.back()[i]) maxx = i;
    return maxx;
}